

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  char in_AL;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  undefined4 uVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list v;
  void *local_130;
  undefined4 local_124;
  ulong local_120;
  long local_118;
  ulong local_110;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar6 = (undefined4)((ulong)_comp >> 0x20);
  iVar1 = (int)_comp;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = v;
    local_108.gp_offset = 0x30;
    local_108.fp_offset = 0x30;
    iVar5 = iVar1;
    stbiw__writefv(s,fmt,&local_108);
    local_124 = 0;
    if (0 < y) {
      uVar3 = (ulong)(uint)y;
      local_120 = (ulong)(uint)x;
      local_118 = (long)x * (long)iVar1;
      local_130 = (void *)((uVar3 - 1) * local_118 + (long)data);
      local_118 = -local_118;
      do {
        uVar2 = local_120;
        pvVar4 = local_130;
        local_110 = uVar3;
        if (0 < x) {
          do {
            stbiw__write_pixel(s,iVar1,alpha,expand_mono,(int)pvVar4,(uchar *)CONCAT44(uVar6,iVar5))
            ;
            uVar2 = uVar2 - 1;
            pvVar4 = (void *)((long)pvVar4 + (long)iVar1);
          } while (uVar2 != 0);
        }
        uVar3 = local_110 - 1;
        (*s->func)(s->context,&local_124,pad);
        local_130 = (void *)((long)local_130 + local_118);
      } while (uVar3 != 0);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   if (y < 0 || x < 0) {
      return 0;
   } else {
      va_list v;
      va_start(v, fmt);
      stbiw__writefv(s, fmt, v);
      va_end(v);
      stbiw__write_pixels(s,rgb_dir,vdir,x,y,comp,data,alpha,pad, expand_mono);
      return 1;
   }
}